

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O0

void textui_cmd_rest(void)

{
  _Bool _Var1;
  command *pcVar2;
  wchar_t local_1c;
  char cStack_15;
  wchar_t turns;
  char *pcStack_10;
  char out_val [5];
  char *p;
  
  pcStack_10 = "Rest (0-9999, \'!\': HP/SP, \'*\': HP+SP, \'&\': all, \'$\': sunrise/set): ";
  _cStack_15 = 0x2026;
  turns._3_1_ = 0;
  _Var1 = get_string("Rest (0-9999, \'!\': HP/SP, \'*\': HP+SP, \'&\': all, \'$\': sunrise/set): ",
                     &cStack_15,5);
  if (_Var1) {
    if (cStack_15 == '&') {
      cmdq_push(CMD_REST);
      pcVar2 = cmdq_peek();
      cmd_set_arg_choice(pcVar2,"choice",L'\xfffffffe');
    }
    else if (cStack_15 == '*') {
      cmdq_push(CMD_REST);
      pcVar2 = cmdq_peek();
      cmd_set_arg_choice(pcVar2,"choice",L'\xffffffff');
    }
    else if (cStack_15 == '!') {
      cmdq_push(CMD_REST);
      pcVar2 = cmdq_peek();
      cmd_set_arg_choice(pcVar2,"choice",L'\xfffffffd');
    }
    else if (cStack_15 == '$') {
      cmdq_push(CMD_REST);
      pcVar2 = cmdq_peek();
      cmd_set_arg_choice(pcVar2,"choice",L'\xfffffffc');
    }
    else {
      local_1c = atoi(&cStack_15);
      if (L'\0' < local_1c) {
        if (L'✏' < local_1c) {
          local_1c = L'✏';
        }
        cmdq_push(CMD_REST);
        pcVar2 = cmdq_peek();
        cmd_set_arg_choice(pcVar2,"choice",local_1c);
      }
    }
  }
  return;
}

Assistant:

void textui_cmd_rest(void)
{
	const char *p = "Rest (0-9999, '!': HP/SP, '*': HP+SP, '&': all, '$': sunrise/set): ";

	char out_val[5] = "& ";

	/* Ask for duration */
	if (!get_string(p, out_val, sizeof(out_val))) return;

	/* Rest... */
	if (out_val[0] == '&') {
		/* ...until done */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_COMPLETE);
	} else if (out_val[0] == '*') {
		/* ...a lot */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_ALL_POINTS);
	} else if (out_val[0] == '!') {
		/* ...until HP or SP filled */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_SOME_POINTS);
	} else if (out_val[0] == '$') {
		/* ...until sunrise or sunset */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_SUNLIGHT);
	} else {
		/* ...some */
		int turns = atoi(out_val);
		if (turns <= 0) return;
		if (turns > 9999) turns = 9999;

		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", turns);
	}
}